

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example007_random_generator.cpp
# Opt level: O2

bool local_random::generate<unsigned_short,void>(void)

{
  bool bVar1;
  wide_integer_type n;
  random_engine_type generator;
  result_type local_a68;
  uniform_int_distribution<256u,unsigned_int,void,false> local_a48 [8];
  value_type_conflict avStack_a40 [2];
  value_type_conflict local_a38 [2];
  value_type_conflict avStack_a30 [12];
  uintwide_t<256U,_unsigned_int,_void,_false> local_a00;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9e0;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&local_9e0);
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::limits_helper_min<false>();
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::limits_helper_max<false>();
  local_a38[0] = local_a68.values.super_array<unsigned_int,_8UL>.elems[4];
  local_a38[1] = local_a68.values.super_array<unsigned_int,_8UL>.elems[5];
  avStack_a30[0] = local_a68.values.super_array<unsigned_int,_8UL>.elems[6];
  avStack_a30[1] = local_a68.values.super_array<unsigned_int,_8UL>.elems[7];
  local_a48 = (uniform_int_distribution<256u,unsigned_int,void,false>  [8])
              local_a68.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  avStack_a40[0] = local_a68.values.super_array<unsigned_int,_8UL>.elems[2];
  avStack_a40[1] = local_a68.values.super_array<unsigned_int,_8UL>.elems[3];
  math::wide_integer::uniform_int_distribution<256u,unsigned_int,void,false>::operator()
            (&local_a68,local_a48,&local_9e0);
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t
            (&local_a00,"0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6");
  bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::operator==
                    (&local_a68,&local_a00);
  return bVar1;
}

Assistant:

auto generate() -> bool
  {
    using random_engine_type = std::mersenne_twister_engine<std::uint64_t,
                                                            static_cast<std::size_t>(UINT32_C( 64)),
                                                            static_cast<std::size_t>(UINT32_C(312)),
                                                            static_cast<std::size_t>(UINT32_C(156)),
                                                            static_cast<std::size_t>(UINT32_C( 31)),
                                                            UINT64_C(0xB5026F5AA96619E9),
                                                            static_cast<std::size_t>(UINT32_C( 29)),
                                                            UINT64_C(0x5555555555555555),
                                                            static_cast<std::size_t>(UINT32_C( 17)),
                                                            UINT64_C(0x71D67FFFEDA60000),
                                                            static_cast<std::size_t>(UINT32_C( 37)),
                                                            UINT64_C(0xFFF7EEE000000000),
                                                            static_cast<std::size_t>(UINT32_C( 43)),
                                                            UINT64_C(6364136223846793005)>;

    #if defined(WIDE_INTEGER_NAMESPACE)
    using wide_integer_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uintwide_t<static_cast<WIDE_INTEGER_NAMESPACE::math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #else
    using wide_integer_type  = ::math::wide_integer::uintwide_t<static_cast<math::wide_integer::size_t>(UINT32_C(256)), std::uint32_t, AllocatorType>;
    using distribution_type  = ::math::wide_integer::uniform_int_distribution<wide_integer_type::my_width2, typename wide_integer_type::limb_type>;
    #endif

    // Generate a random number with wide_integer_type having limbs of type LimbType.
    // Purosely use the default seed.
    random_engine_type generator; // NOLINT(cert-msc32-c,cert-msc51-cpp)

    distribution_type distribution { };

    const wide_integer_type n = distribution(generator);

    const auto result_is_ok =
      (n == wide_integer_type("0xF258D22D4DB91392B5EE8CB6ABE457F8401F7AC78BC80F1CC96D191CF6F6AEA6"));

    return result_is_ok;
  }